

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O0

bool xercesc_4_0::XMLChar1_1::isValidNmtoken(XMLCh *toCheck,XMLSize_t count)

{
  XMLCh XVar1;
  bool bVar2;
  bool gotLeadingSurrogate;
  XMLCh nextCh;
  XMLCh *endPtr;
  XMLCh *curCh;
  XMLSize_t count_local;
  XMLCh *toCheck_local;
  
  if (count == 0) {
    toCheck_local._7_1_ = false;
  }
  else {
    bVar2 = false;
    endPtr = toCheck;
    while (endPtr < toCheck + count) {
      XVar1 = *endPtr;
      if (((ushort)XVar1 < 0xd800) || (0xdbff < (ushort)XVar1)) {
        if (((ushort)XVar1 < 0xdc00) || (0xdfff < (ushort)XVar1)) {
          if (bVar2) {
            return false;
          }
          if (((&fgCharCharsTable1_1)[(ushort)XVar1] & 4) == 0) {
            return false;
          }
        }
        else if (!bVar2) {
          return false;
        }
        bVar2 = false;
        endPtr = endPtr + 1;
      }
      else {
        if ((0xdb7f < (ushort)XVar1) || (bVar2)) {
          return false;
        }
        bVar2 = true;
        endPtr = endPtr + 1;
      }
    }
    toCheck_local._7_1_ = true;
  }
  return toCheck_local._7_1_;
}

Assistant:

bool XMLChar1_1::isValidNmtoken(const   XMLCh*        const    toCheck
                              , const   XMLSize_t              count)
{
    if (count == 0)
        return false;

    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;
    XMLCh nextCh;

    bool    gotLeadingSurrogate = false;
    while (curCh < endPtr)
    {
        nextCh = *curCh++;

        // Deal with surrogate pairs
        if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
        {
            //  It's a leading surrogate. If we already got one, then
            //  issue an error, else set leading flag to make sure that
            //  we look for a trailing next time.
            if (nextCh > 0xDB7F || gotLeadingSurrogate)
            {
                return false;
            }
            else
                gotLeadingSurrogate = true;
        }
        else
        {
            //  If it's a trailing surrogate, make sure that we are
            //  prepared for that. Else, it's just a regular char so make
            //  sure that we were not expected a trailing surrogate.
            if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
            {
                // It's trailing, so make sure we were expecting it
                if (!gotLeadingSurrogate)
                    return false;
            }
            else
            {
                //  It's just a char, so make sure we were not expecting a
                //  trailing surrogate.
                if (gotLeadingSurrogate) {
                    return false;
                }
                // It's got to at least be a valid XML character
                else if (!(fgCharCharsTable1_1[nextCh] & gNameCharMask))
                {
                    return false;
                }
            }
            gotLeadingSurrogate = false;
        }
    }
    return true;
}